

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcm.c
# Opt level: O0

uchar * mcmalo0(mcmcxdef *cctx,ushort siz,mcmon *nump,mcmon clinum,int noclitrans)

{
  int iVar1;
  ushort in_CX;
  ushort *in_RDX;
  undefined8 *in_RDI;
  int in_R8D;
  int unused;
  int found;
  mcmon *q;
  mcmon j;
  uint i;
  mcmon **p;
  mcmon glb;
  mcmcx1def *ctx;
  uchar *ret;
  char *in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  short *in_stack_ffffffffffffffa8;
  mcmon clinum_00;
  undefined2 in_stack_ffffffffffffffb0;
  ushort in_stack_ffffffffffffffb2;
  uint in_stack_ffffffffffffffb4;
  mcmon *in_stack_ffffffffffffffb8;
  long *plVar2;
  ushort in_stack_ffffffffffffffc6;
  mcmcx1def *ctx_00;
  ushort local_22;
  uchar *local_8;
  
  ctx_00 = (mcmcx1def *)*in_RDI;
  local_8 = mcmalo1(ctx_00,in_stack_ffffffffffffffc6,in_stack_ffffffffffffffb8);
  if (local_8 == (uchar *)0x0) {
    mcmgarb((mcmcx1def *)0x0);
    while (local_8 = mcmalo1(ctx_00,in_stack_ffffffffffffffc6,in_stack_ffffffffffffffb8),
          local_8 == (uchar *)0x0) {
      iVar1 = mcmswap((mcmcx1def *)
                      CONCAT44(in_stack_ffffffffffffffb4,
                               CONCAT22(in_stack_ffffffffffffffb2,in_stack_ffffffffffffffb0)),
                      (ushort)((ulong)in_stack_ffffffffffffffa8 >> 0x30));
      if (iVar1 == 0) {
        local_8 = mcmalo1(ctx_00,in_stack_ffffffffffffffc6,in_stack_ffffffffffffffb8);
        if (local_8 == (uchar *)0x0) {
          errsigf((errcxdef *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                  in_stack_ffffffffffffff98,0);
        }
        break;
      }
      local_8 = mcmalo1(ctx_00,in_stack_ffffffffffffffc6,in_stack_ffffffffffffffb8);
      if (local_8 != (uchar *)0x0) break;
      mcmgarb((mcmcx1def *)0x0);
    }
  }
  clinum_00 = (mcmon)((ulong)in_stack_ffffffffffffffa8 >> 0x30);
  if (in_R8D == 0) {
    local_22 = in_CX;
    if (in_CX == 0xffff) {
      in_stack_ffffffffffffffa4 = 0;
      in_stack_ffffffffffffffa0 = 0xffffffff;
      plVar2 = in_RDI + 6;
      for (in_stack_ffffffffffffffb4 = 0;
          clinum_00 = (mcmon)((ulong)in_stack_ffffffffffffffa8 >> 0x30),
          in_stack_ffffffffffffffb4 < *(uint *)((long)in_RDI + 0xc);
          in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb4 + 1) {
        if (*plVar2 == 0) {
          if (in_stack_ffffffffffffffa0 == 0xffffffff) {
            in_stack_ffffffffffffffa0 = in_stack_ffffffffffffffb4;
          }
        }
        else {
          in_stack_ffffffffffffffa8 = (short *)*plVar2;
          for (in_stack_ffffffffffffffb2 = 0; in_stack_ffffffffffffffb2 < 0x100;
              in_stack_ffffffffffffffb2 = in_stack_ffffffffffffffb2 + 1) {
            if (*in_stack_ffffffffffffffa8 == -1) {
              in_stack_ffffffffffffffa4 = 1;
              break;
            }
            in_stack_ffffffffffffffa8 = in_stack_ffffffffffffffa8 + 1;
          }
        }
        clinum_00 = (mcmon)((ulong)in_stack_ffffffffffffffa8 >> 0x30);
        if (in_stack_ffffffffffffffa4 != 0) break;
        plVar2 = plVar2 + 1;
      }
      if (in_stack_ffffffffffffffa4 == 0) {
        if (in_stack_ffffffffffffffa0 == 0xffffffff) {
          errsigf((errcxdef *)0xffffffff,in_stack_ffffffffffffff98,0);
        }
        local_22 = (ushort)(in_stack_ffffffffffffffa0 << 8);
      }
      else {
        local_22 = (short)(in_stack_ffffffffffffffb4 << 8) + in_stack_ffffffffffffffb2;
      }
    }
    mcmcliexp((mcmcxdef *)
              CONCAT44(in_stack_ffffffffffffffb4,
                       CONCAT22(in_stack_ffffffffffffffb2,in_stack_ffffffffffffffb0)),clinum_00);
    if (*(short *)(in_RDI[(long)((int)(uint)local_22 >> 8) + 6] + (long)(int)(local_22 & 0xff) * 2)
        != -1) {
      errsigf((errcxdef *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
              in_stack_ffffffffffffff98,0);
    }
    *(ushort *)(in_RDI[(long)((int)(uint)local_22 >> 8) + 6] + (long)(int)(local_22 & 0xff) * 2) =
         in_stack_ffffffffffffffc6;
    if (in_RDX != (ushort *)0x0) {
      *in_RDX = local_22;
    }
  }
  else {
    *in_RDX = in_stack_ffffffffffffffc6;
  }
  return local_8;
}

Assistant:

uchar *mcmalo0(mcmcxdef *cctx, ushort siz, mcmon *nump,
               mcmon clinum, int noclitrans)
{
    uchar     *ret;
    mcmcx1def *ctx = cctx->mcmcxgl;                       /* global context */
    mcmon      glb;                       /* global object number allocated */
    
    MCMCLICTX(cctx);
    MCMGLBCTX(ctx);
    
    /* try once */
    if ((ret = mcmalo1(ctx, siz, &glb)) != 0)
        goto done;

    /* collect some garbage */
    mcmgarb(ctx);
    
    /* try swapping until we get the memory or have nothing left to swap */
    for ( ;; )
    {
        /* try again */
        if ((ret = mcmalo1(ctx, siz, &glb)) != 0)
            goto done;

        /* nothing left to swap? */
        if (!mcmswap(ctx, siz))
            break;

        /* try yet again */
        if ((ret = mcmalo1(ctx, siz, &glb)) != 0)
            goto done;

        /* collect garbage once again */        
        mcmgarb(ctx);
    }
    
    /* try again */
    if ((ret = mcmalo1(ctx, siz, &glb)) != 0)
        goto done;
    
    /* we have no other way of getting more memory, so signal an error */
    errsig(ctx->mcmcxerr, ERR_NOMEM1);
    NOTREACHEDV(uchar *);
    
done:
    if (noclitrans)
    {
        *nump = glb;
        return(ret);
    }
    
    /* we have an object - generate client number */
    if (clinum == MCMONINV)
    {
        /* find a free number */
        mcmon **p;
        uint    i;
        mcmon   j;
        mcmon  *q;
        int     found = FALSE;
        int     unused = -1;
        
        for (i = 0, p = cctx->mcmcxmtb ; i < cctx->mcmcxmsz ; ++i, ++p)
        {
            if (*p)
            {
                for (j = 0, q = *p ; j < 256 ; ++j, ++q)
                {
                    if (*q == MCMONINV)
                    {
                        found = TRUE;
                        break;
                    }
                }
            }
            else if (unused == -1)
                unused = i;            /* note an unused page mapping table */

            if (found) break;
        }
        
        if (found)
            clinum = (i << 8) + j;
        else if (unused != -1)
            clinum = (unused << 8);
        else
            errsig(ctx->mcmcxerr, ERR_CLIFULL);
    }

    /* expand client mapping table if necessary */
    mcmcliexp(cctx, clinum);

    /* make sure the entry isn't already in use */
    if (mcmc2g(cctx, clinum) != MCMONINV)
        errsig(ctx->mcmcxerr, ERR_CLIUSE);

    cctx->mcmcxmtb[clinum >> 8][clinum & 255] = glb;
    if (nump) *nump = clinum;
    return(ret);
}